

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall DBOPL::Operator::Write60(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  
  bVar1 = this->reg60 ^ val;
  this->reg60 = val;
  if ((bVar1 & 0xf) != 0) {
    if ((val & 0xf) == 0) {
      this->decayAdd = 0;
      this->rateZero = this->rateZero | 8;
    }
    else {
      this->decayAdd = chip->linearRates[(byte)((val & 0xf) * '\x04' + this->ksr)];
      this->rateZero = this->rateZero & 0xf7;
    }
  }
  if (0xf < bVar1) {
    if (0xf < val) {
      this->attackAdd = chip->attackRates[(byte)((val >> 2 & 0x3c) + this->ksr)];
      this->rateZero = this->rateZero & 0xef;
      return;
    }
    this->attackAdd = 0;
    this->rateZero = this->rateZero | 0x10;
  }
  return;
}

Assistant:

void Operator::Write60( const Chip* chip, Bit8u val ) {
	Bit8u change = reg60 ^ val;
	reg60 = val;
	if ( change & 0x0f ) {
		UpdateDecay( chip );
	}
	if ( change & 0xf0 ) {
		UpdateAttack( chip );
	}
}